

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int multiquery(int sockfd,sockaddr_in *to,char **questions,size_t questions_size)

{
  ushort uVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  char *dest;
  char buffer [520];
  
  dest = buffer + 0xc;
  buffer[0] = '\0';
  buffer[1] = '\x02';
  buffer[2] = '\x01';
  buffer[3] = '\0';
  uVar1 = (ushort)questions_size << 8 | (ushort)questions_size >> 8;
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[4] = (char)uVar1;
  buffer[5] = (char)(uVar1 >> 8);
  for (sVar4 = 0; questions_size != sVar4; sVar4 = sVar4 + 1) {
    iVar2 = str_to_label(dest,questions[sVar4],((int)buffer - (int)dest) + 0x208);
    pcVar8 = dest + iVar2;
    dest = pcVar8 + 0x104;
    pcVar8[0] = '\0';
    pcVar8[1] = '\x01';
    pcVar8[2] = '\0';
    pcVar8[3] = '\x01';
  }
  uVar7 = (int)dest - (int)buffer;
  uVar5 = 0;
  if (0 < (int)uVar7) {
    uVar5 = (ulong)uVar7;
  }
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    printf("%d",(ulong)(uint)(int)buffer[uVar6]);
  }
  iVar2 = 0;
  sVar3 = sendto(sockfd,buffer,(long)(int)uVar7,0,(sockaddr *)to,0x10);
  if (sVar3 < 0) {
    puts("Failed");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int multiquery(int sockfd, struct sockaddr_in *to, char *questions[],
               size_t questions_size) {
  struct header_struct *header;
  struct question_struct *question;
  char *qname_pos, *question_pos;
  char buffer[MAX_DNS_SIZE];
  int i, qname_size = 0;
  int total_size = 0;

  header = (struct header_struct *)&buffer; //直接在buffer上写
  init_header(header);
  header->qdcount = htons(questions_size);

  qname_pos = buffer + DNS_HEADER_SIZE; //第一个question的位置
  for (i = 0; i < questions_size; i++) {
    qname_size = str_to_label(qname_pos, questions[i],
                              MAX_DNS_SIZE - (qname_pos - buffer));
    question_pos = qname_pos + qname_size;
    question = (struct question_struct *)question_pos;
    question->qclass = htons(1);
    question->qtype = htons(1);
    qname_pos += qname_size + QUERY_SIZE; //加上整个question的偏移量
  }
  total_size = qname_pos - buffer;
  for (int i = 0; i < total_size; i++) {
    printf("%d", buffer[i]);
  }
  if (sendto(sockfd, (char *)buffer, total_size, 0, (struct sockaddr *)to,
             sizeof(struct sockaddr_in)) < 0) {
    printf("Failed\n");
    return -1;
  }
  return 0;
}